

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 4.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  
  printf("%5s\t%6s\n","Celc","Fahr");
  uVar1 = 0xffffffec;
  do {
    uVar1 = uVar1 + 0x14;
    printf("%5.0f\t%6.0f\n",(double)(int)uVar1,(double)(float)((double)(int)uVar1 * 1.8 + 32.0));
  } while (uVar1 < 0x119);
  return 0;
}

Assistant:

int main()
{
    float fahr, celcius;
    int lower, upper, step;

    lower = 0;
    upper = 300;
    step = 20;

    celcius = lower;

    printf("%5s\t%6s\n", "Celc", "Fahr");
    while (celcius <= upper) {
        fahr = ((9.0/5.0) * celcius) + 32;
        printf("%5.0f\t%6.0f\n", celcius, fahr);
        celcius = celcius + step;
    }
}